

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

double __thiscall FeeFilterRounder::round(FeeFilterRounder *this,double __x)

{
  bool bVar1;
  uint64_t uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  long in_RSI;
  long in_FS_OFFSET;
  bool bVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (this->m_fee_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->m_fee_set)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    dVar7 = (double)in_RSI;
    p_Var4 = p_Var5;
    do {
      bVar6 = dVar7 != *(double *)(p_Var3 + 1);
      bVar1 = *(double *)(p_Var3 + 1) <= dVar7;
      if (!bVar1 || !bVar6) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar1 && bVar6];
    } while (p_Var3 != (_Base_ptr)0x0);
    bVar6 = p_Var4 != p_Var5;
    p_Var5 = p_Var4;
    if (bVar6) {
      if (p_Var4 == (this->m_fee_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      goto LAB_0098614d;
      local_28._M_device = &(this->m_insecure_rand_mutex).super_mutex;
      local_28._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_28);
      uVar2 = RandomMixin<FastRandomContext>::randbits<32>
                        (&this->insecure_rand->super_RandomMixin<FastRandomContext>);
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
      dVar7 = extraout_XMM0_Qa;
      if ((uint)((int)uVar2 * -0x55555555) < 0x55555556) goto LAB_0098614d;
    }
  }
  dVar7 = (double)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var5);
LAB_0098614d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return dVar7;
}

Assistant:

CAmount FeeFilterRounder::round(CAmount currentMinFee)
{
    AssertLockNotHeld(m_insecure_rand_mutex);
    std::set<double>::iterator it = m_fee_set.lower_bound(currentMinFee);
    if (it == m_fee_set.end() ||
        (it != m_fee_set.begin() &&
         WITH_LOCK(m_insecure_rand_mutex, return insecure_rand.rand32()) % 3 != 0)) {
        --it;
    }
    return static_cast<CAmount>(*it);
}